

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_node_copy_cstr(mpack_node_t node,char *buffer,size_t bufsize)

{
  _Bool _Var1;
  mpack_error_t mVar2;
  char *pcVar3;
  mpack_node_data_t *pmVar4;
  size_t bufsize_local;
  char *buffer_local;
  mpack_node_t node_local;
  
  pmVar4 = node.data;
  mVar2 = mpack_node_error(node);
  if (mVar2 == mpack_ok) {
    if (pmVar4->type == mpack_type_str) {
      if (bufsize - 1 < (ulong)pmVar4->len) {
        *buffer = '\0';
        mpack_node_flag_error(node,mpack_error_too_big);
      }
      else {
        pcVar3 = mpack_node_data_unchecked(node);
        _Var1 = mpack_str_check_no_null(pcVar3,(ulong)pmVar4->len);
        if (_Var1) {
          pcVar3 = mpack_node_data_unchecked(node);
          memcpy(buffer,pcVar3,(ulong)pmVar4->len);
          buffer[pmVar4->len] = '\0';
        }
        else {
          *buffer = '\0';
          mpack_node_flag_error(node,mpack_error_type);
        }
      }
    }
    else {
      *buffer = '\0';
      mpack_node_flag_error(node,mpack_error_type);
    }
  }
  else {
    *buffer = '\0';
  }
  return;
}

Assistant:

void mpack_node_copy_cstr(mpack_node_t node, char* buffer, size_t bufsize) {

    // we can't break here because the error isn't recoverable; we
    // have to add a null-terminator.
    mpack_assert(buffer != NULL, "buffer is NULL");
    mpack_assert(bufsize >= 1, "buffer size is zero; you must have room for at least a null-terminator");

    if (mpack_node_error(node) != mpack_ok) {
        buffer[0] = '\0';
        return;
    }

    if (node.data->type != mpack_type_str) {
        buffer[0] = '\0';
        mpack_node_flag_error(node, mpack_error_type);
        return;
    }

    if (node.data->len > bufsize - 1) {
        buffer[0] = '\0';
        mpack_node_flag_error(node, mpack_error_too_big);
        return;
    }

    if (!mpack_str_check_no_null(mpack_node_data_unchecked(node), node.data->len)) {
        buffer[0] = '\0';
        mpack_node_flag_error(node, mpack_error_type);
        return;
    }

    mpack_memcpy(buffer, mpack_node_data_unchecked(node), node.data->len);
    buffer[node.data->len] = '\0';
}